

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.hpp
# Opt level: O2

void __thiscall Movegen::generate<(Movetype)16,(Piece)0>(Movegen *this)

{
  int d2;
  int d1;
  U64 caps_l;
  U64 caps_r;
  int local_28;
  int local_24;
  U64 local_20;
  U64 local_18;
  
  local_20 = 0;
  local_18 = 0;
  local_28 = (uint)(this->us != white) * 0x10;
  local_24 = local_28 + -7;
  local_28 = local_28 + -9;
  capture_promotions(this,&local_18,&local_20);
  if (local_18 != 0) {
    encode_capture_promotions(this,&local_18,&local_24);
  }
  if (local_20 != 0) {
    encode_capture_promotions(this,&local_20,&local_28);
  }
  return;
}

Assistant:

inline void Movegen::generate<capture_promotion, pawn>() {
	U64 caps_l = 0;
	U64 caps_r = 0;
	int d1 = (us == white ? -7 : 9);
	int d2 = (us == white ? -9 : 7);
	capture_promotions(caps_r, caps_l);
	if (caps_r != 0ULL) encode_capture_promotions(caps_r, d1);
	if (caps_l != 0ULL) encode_capture_promotions(caps_l, d2);
}